

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasmtool.c
# Opt level: O1

void handle_shemu(PDISASM_OPTIONS Options)

{
  size_t __size;
  uint8_t *__src;
  ulong uVar1;
  char *__s;
  int *piVar2;
  SHEMU_STATUS SVar3;
  size_t sVar4;
  ND_UINT64 NVar5;
  ND_UINT8 *__s_00;
  ND_UINT8 *__s_01;
  ND_UINT8 *__s_02;
  FILE *__s_03;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  char *local_eb8;
  SHEMU_CONTEXT local_eb0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __src = Options->Buffer;
  sVar6 = Options->Size;
  memset(&local_eb0,0,0xe78);
  uVar1 = Options->Rip;
  __s = Options->FileName;
  if (Options->SkipWriteDecoded == false) {
    if (__s == (char *)0x0) {
      local_eb8 = "hex_string_decoded.bin";
    }
    else {
      sVar4 = strlen(__s);
      local_eb8 = (char *)malloc(sVar4 + 0xd);
      sprintf(local_eb8,"%s_decoded.bin",__s);
    }
  }
  else {
    local_eb8 = (char *)0x0;
  }
  sVar4 = sVar6 + 0x100;
  uVar7 = 0x200000;
  if (uVar1 != 0) {
    uVar7 = uVar1 & 0xfffffffffffff000;
  }
  NVar5 = Options->Offset + uVar7;
  __s_00 = (ND_UINT8 *)malloc(sVar4);
  local_eb0.Shellcode = __s_00;
  __s_01 = (ND_UINT8 *)malloc(0x2000);
  __size = sVar6 + 0x2100;
  local_eb0.Stack = __s_01;
  __s_02 = (ND_UINT8 *)malloc(__size);
  local_eb0.Intbuf = __s_02;
  memset(__s_00,0,sVar4);
  memset(__s_01,0,0x2000);
  memcpy(__s_00,__src,sVar6);
  memset(__s_02,0,__size);
  local_eb0.StackBase = uVar7 - 0x3000;
  local_eb0.StackSize = 0x2000;
  local_eb0.ArchType = SHEMU_ARCH_TYPE_X86;
  local_eb0.Arch.X86.Mode = Options->Mode;
  local_eb0.Arch.X86.Ring = Options->Ring;
  local_eb0.Arch.X86.Registers.RegFlags = 0x202;
  local_eb0.Arch.X86.Registers.RegRsp = uVar7 - 0x2000;
  if (local_eb0.Arch.X86.Mode == '\x02') {
    local_eb0.Arch.X86.Segments.Fs.Base = 0;
    local_eb0.Arch.X86.Segments.Cs.Selector = 0x10;
    if (local_eb0.Arch.X86.Ring == '\x03') {
      local_eb0.Arch.X86.Segments.Cs.Selector = 0x33;
    }
    local_eb0.Arch.X86.Segments.Ds.Selector = 0x18;
    local_eb0.Arch.X86.Segments.Fs.Selector = local_eb0.Arch.X86.Segments.Fs.Base;
    if (local_eb0.Arch.X86.Ring == '\x03') {
      local_eb0.Arch.X86.Segments.Ds.Selector = 0x2b;
      local_eb0.Arch.X86.Segments.Fs.Selector = 0x2b;
    }
    local_eb0.Arch.X86.Segments.Gs.Base = 0x7fff0000;
    local_eb0.Arch.X86.Segments.Gs.Selector = 0x53;
  }
  else {
    bVar9 = local_eb0.Arch.X86.Ring == '\x03';
    local_eb0.Arch.X86.Segments.Cs.Selector = 8;
    if (bVar9) {
      local_eb0.Arch.X86.Segments.Cs.Selector = 0x1b;
    }
    local_eb0.Arch.X86.Segments.Gs.Selector = 0x23;
    local_eb0.Arch.X86.Segments.Ds.Selector = 0x10;
    if (bVar9) {
      local_eb0.Arch.X86.Segments.Ds.Selector = 0x23;
    }
    local_eb0.Arch.X86.Segments.Fs.Selector = 0x30;
    if (bVar9) {
      local_eb0.Arch.X86.Segments.Fs.Selector = 0x3b;
    }
    local_eb0.Arch.X86.Segments.Fs.Base = 0x7fff0000;
    local_eb0.Arch.X86.Segments.Gs.Base = 0;
  }
  if (local_eb0.Arch.X86.Ring != '\x03') {
    local_eb0.Arch.X86.Segments.Gs.Selector = 0;
  }
  local_eb0.Arch.X86.Registers.RegCr0 = 0x80050031;
  local_eb0.Arch.X86.Registers.RegCr4 = 0x170678;
  local_eb0.Arch.X86.Registers.RegRip = NVar5;
  local_eb0.Arch.X86.Segments.Es.Selector = local_eb0.Arch.X86.Segments.Ds.Selector;
  local_eb0.Arch.X86.Segments.Ss.Selector = local_eb0.Arch.X86.Segments.Ds.Selector;
  local_eb0.ShellcodeBase = uVar7;
  local_eb0.ShellcodeSize = sVar4;
  local_eb0.IntbufSize = __size;
  if ((Options->UseShemuRegs == true) &&
     (memcpy((void *)((long)&local_eb0.Arch + 0x1e8),Options->ShemuRegs,0x100),
     local_eb0.Arch.X86.Registers.RegRsp != 0)) {
    local_eb0.StackBase = local_eb0.Arch.X86.Registers.RegRsp - 0x1000;
  }
  local_eb0.TibBase = 0x7fff0000;
  local_eb0.MaxInstructionsCount = 10000;
  local_eb0.Flags = 0;
  local_eb0.Options = 0x99;
  local_eb0.Log = ShemuLog;
  local_eb0.AccessMemory = ShemuAccessMem;
  local_eb0.AccessShellcode = ShemuAccessShellcode;
  local_eb0.NopThreshold = 0x4b;
  local_eb0.StrThreshold = 8;
  local_eb0.MemThreshold = 0;
  piVar2 = (int *)cpuid_basic_info(0);
  if ((*piVar2 != 0) && (lVar8 = cpuid_Version_info(1), (*(uint *)(lVar8 + 0xc) >> 0x19 & 1) != 0))
  {
    local_eb0.Options = 0x100000099;
  }
  if (Options->BypassSelfWrites == true) {
    local_eb0.Options = local_eb0.Options | 4;
  }
  local_eb0.Options = local_eb0.Options | 0x200000000;
  SVar3 = ShemuX86Emulate(&local_eb0);
  printf("Emulation terminated with status 0x%08x, flags: 0x%llx, %llu NOPs, %llu NULLs, %llu total instructions, %llu unique instructions\n"
         ,(ulong)SVar3,local_eb0.Flags,local_eb0.NopCount,local_eb0.NullCount,
         local_eb0.InstructionsCount,local_eb0.UniqueCount);
  lVar8 = 8;
  do {
    if ((local_eb0.Flags & *(ulong *)(&UNK_001fc5d8 + lVar8)) != 0) {
      printf("        %s\n",*(undefined8 *)((long)&DAT_001fc5e0 + lVar8));
    }
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0xf8);
  if (local_eb8 != (char *)0x0) {
    __s_03 = fopen(local_eb8,"wb");
    if (__s_03 == (FILE *)0x0) {
      printf("Could not create the file %s\n",local_eb8);
    }
    else {
      sVar6 = fwrite(local_eb0.Shellcode,1,sVar6,__s_03);
      if (sVar6 == 0) {
        printf("No bytes written to %s!\n",local_eb8);
      }
      fclose(__s_03);
    }
  }
  if (__s != (char *)0x0 && local_eb8 != (char *)0x0) {
    free(local_eb8);
  }
  if (local_eb0.Shellcode != (ND_UINT8 *)0x0) {
    free(local_eb0.Shellcode);
  }
  if (local_eb0.Stack != (ND_UINT8 *)0x0) {
    free(local_eb0.Stack);
  }
  if (local_eb0.Intbuf != (ND_UINT8 *)0x0) {
    free(local_eb0.Intbuf);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
handle_shemu(
    PDISASM_OPTIONS Options
    )
{
    SHEMU_CONTEXT ctx;
    SHEMU_STATUS shstatus;
    char *fileName;
    size_t rip = 0, fsize = Options->Size, offset = 0, decFileNameLength = 0, shellSize;
    char *fNameDecoded;
    PBYTE buffer = Options->Buffer;

    memset(&ctx, 0, sizeof(ctx));
    rip = Options->Rip;
    fileName = Options->FileName;

    if (!Options->SkipWriteDecoded)
    {
        if (fileName == NULL)
        {
            fNameDecoded = "hex_string_decoded.bin";
        }
        else
        {
            decFileNameLength = strlen(fileName) + sizeof("_decoded.bin");
            fNameDecoded = malloc(sizeof(char) * decFileNameLength);
        
            // This is safe, we allocated enough space.
            sprintf(fNameDecoded, "%s_decoded.bin", fileName);
        }
    }
    else
    {
        fNameDecoded = NULL;
    }

    offset = Options->Offset;

    // A little extra space, since shellcodes tend to do accesses after their code...
    shellSize = fsize + 0x100;

    // Allocate the shellcode, stack, shell bitmap and stack bitmaps.
    ctx.Shellcode = malloc(shellSize);

#define STACK_SIZE  0x2000ull
    ctx.Stack = malloc(STACK_SIZE);
    ctx.Intbuf = malloc(shellSize + STACK_SIZE);

    memset(ctx.Shellcode, 0, shellSize);
    memset(ctx.Stack, 0, STACK_SIZE);
    memcpy(ctx.Shellcode, buffer, fsize);
    memset(ctx.Intbuf, 0, shellSize + STACK_SIZE);

    // Use the provided RIP, if any. Otherwise, use a hard-coded value.
    ctx.ShellcodeBase = (rip != 0 ? rip & PAGE_MASK : 0x200000);
    ctx.ShellcodeSize = shellSize;
    ctx.StackBase = (ctx.ShellcodeBase & PAGE_MASK) - STACK_SIZE - 0x1000;
    ctx.StackSize = STACK_SIZE;
    
    ctx.IntbufSize = shellSize + STACK_SIZE;

    ctx.ArchType = SHEMU_ARCH_TYPE_X86;

    ctx.Arch.X86.Mode = Options->Mode;
    ctx.Arch.X86.Ring = Options->Ring;

    ctx.Arch.X86.Registers.RegFlags = NDR_RFLAG_IF | 2;
    ctx.Arch.X86.Registers.RegRip = ctx.ShellcodeBase + offset;
    ctx.Arch.X86.Registers.RegRsp = ctx.StackBase + STACK_SIZE / 2;

    if (ctx.Arch.X86.Mode == ND_CODE_64)
    {
        ctx.Arch.X86.Segments.Cs.Selector = (ctx.Arch.X86.Ring == 3) ? 0x33 : 0x10;
        ctx.Arch.X86.Segments.Ds.Selector = (ctx.Arch.X86.Ring == 3) ? 0x2b : 0x18;
        ctx.Arch.X86.Segments.Es.Selector = (ctx.Arch.X86.Ring == 3) ? 0x2b : 0x18;
        ctx.Arch.X86.Segments.Ss.Selector = (ctx.Arch.X86.Ring == 3) ? 0x2b : 0x18;
        ctx.Arch.X86.Segments.Fs.Selector = (ctx.Arch.X86.Ring == 3) ? 0x2b : 0x00;
        ctx.Arch.X86.Segments.Gs.Selector = (ctx.Arch.X86.Ring == 3) ? 0x53 : 0x00;

        ctx.Arch.X86.Segments.Fs.Base = 0;
        ctx.Arch.X86.Segments.Gs.Base = 0x7FFF0000;
    }
    else
    {
        ctx.Arch.X86.Segments.Cs.Selector = (ctx.Arch.X86.Ring == 3) ? 0x1b : 0x08;
        ctx.Arch.X86.Segments.Ds.Selector = (ctx.Arch.X86.Ring == 3) ? 0x23 : 0x10;
        ctx.Arch.X86.Segments.Es.Selector = (ctx.Arch.X86.Ring == 3) ? 0x23 : 0x10;
        ctx.Arch.X86.Segments.Ss.Selector = (ctx.Arch.X86.Ring == 3) ? 0x23 : 0x10;
        ctx.Arch.X86.Segments.Fs.Selector = (ctx.Arch.X86.Ring == 3) ? 0x3b : 0x30;
        ctx.Arch.X86.Segments.Gs.Selector = (ctx.Arch.X86.Ring == 3) ? 0x23 : 0x00;

        ctx.Arch.X86.Segments.Fs.Base = 0x7FFF0000;
        ctx.Arch.X86.Segments.Gs.Base = 0;
    }

    // Dummy values, to resemble regular CR0/CR4 values.
    ctx.Arch.X86.Registers.RegCr0 = 0x0000000080050031;
    ctx.Arch.X86.Registers.RegCr4 = 0x0000000000170678;

    if (Options->UseShemuRegs)
    {
        // Copy the new GPRs
        memcpy(&ctx.Arch.X86.Registers.RegRax, Options->ShemuRegs, sizeof(Options->ShemuRegs));

        // Update the stack to point to the new RSP, if one exists
        if (ctx.Arch.X86.Registers.RegRsp != 0)
        {
            // Consider the stack base at least with a page before the current RSP. In case of pushes or operations
            // which decrease the RSP, we will always give SHEMU_ABORT_RIP_OUTSIDE otherwise.
            ctx.StackBase = ctx.Arch.X86.Registers.RegRsp - 0x1000;
        }
    }

    ctx.TibBase = 0x7FFF0000;
    ctx.MaxInstructionsCount = 10000;
    ctx.Flags = 0;
    ctx.Options = SHEMU_OPT_TRACE_EMULATION | SHEMU_OPT_TRACE_MEMORY | SHEMU_OPT_TRACE_STRINGS | SHEMU_OPT_TRACE_LOOPS;
    ctx.Log = &ShemuLog;
    ctx.AccessMemory = (ShemuMemAccess)&ShemuAccessMem;
    ctx.AccessShellcode = (ShemuMemAccess)&ShemuAccessShellcode;

    // Configurable thresholds.
    ctx.NopThreshold = SHEMU_DEFAULT_NOP_THRESHOLD;
    ctx.StrThreshold = SHEMU_DEFAULT_STR_THRESHOLD;
    ctx.MemThreshold = SHEMU_DEFAULT_MEM_THRESHOLD;

    // Check for AES support.
    int regs[4] = { 0 };

#if defined(ND_ARCH_X86) || defined(ND_ARCH_X64)
    cpuid(regs, 1);
#endif

    // CPUID leaf function 1, register ECX, bit 25 indicates AES-NI support.
    if (!!(regs[2] & (1UL << 25)))
    {
        ctx.Options |= SHEMU_OPT_SUPPORT_AES;
    }

    if (Options->BypassSelfWrites)
    {
        ctx.Options |= SHEMU_OPT_BYPASS_SELF_WRITES;
    }

    ctx.Options |= SHEMU_OPT_SUPPORT_APX;

    shstatus = ShemuX86Emulate(&ctx);

    // Print each set flag after emulation.
    printf("Emulation terminated with status 0x%08x, flags: 0x%llx, %llu NOPs, %llu NULLs, %llu total instructions, %llu unique instructions\n", 
           shstatus, (unsigned long long)ctx.Flags, ctx.NopCount, ctx.NullCount, ctx.InstructionsCount, ctx.UniqueCount);
    
    struct 
    {
        ND_UINT64   Flag;
        const char* Name;
    } const shemuFlags[] = {
#define FLAGENTRY(f)       { .Flag = f, .Name = #f }
        FLAGENTRY(SHEMU_FLAG_NOP_SLED),
        FLAGENTRY(SHEMU_FLAG_LOAD_RIP),
        FLAGENTRY(SHEMU_FLAG_WRITE_SELF),
        FLAGENTRY(SHEMU_FLAG_TIB_ACCESS_PEB),
        FLAGENTRY(SHEMU_FLAG_SYSCALL),
        FLAGENTRY(SHEMU_FLAG_STACK_STR),
        FLAGENTRY(SHEMU_FLAG_TIB_ACCESS_WOW32),
        FLAGENTRY(SHEMU_FLAG_HEAVENS_GATE),
        FLAGENTRY(SHEMU_FLAG_STACK_PIVOT),
        FLAGENTRY(SHEMU_FLAG_SUD_ACCESS),
        FLAGENTRY(SHEMU_FLAG_KPCR_ACCESS),
        FLAGENTRY(SHEMU_FLAG_SWAPGS),
        FLAGENTRY(SHEMU_FLAG_SYSCALL_MSR_READ),
        FLAGENTRY(SHEMU_FLAG_SYSCALL_MSR_WRITE),
        FLAGENTRY(SHEMU_FLAG_SIDT),
#undef  FLAGENTRY
    };

    for (uint32_t fli = 0; fli < ARRAYSIZE(shemuFlags); fli++)
    {
        if (ctx.Flags & shemuFlags[fli].Flag)
        {
            printf("        %s\n", shemuFlags[fli].Name);
        }
    }

    if (fNameDecoded != NULL)
    {
        size_t outSize;
        FILE *file = fopen(fNameDecoded, "wb");
        if (file == NULL)
        {
            printf("Could not create the file %s\n", fNameDecoded);
            goto cleanup_and_exit;
        }

        outSize = fwrite(ctx.Shellcode, 1, fsize, file);

        if (outSize == 0)
        {
            printf("No bytes written to %s!\n", fNameDecoded);
        }

        fclose(file);
    }

cleanup_and_exit:
    if (NULL != fileName && NULL != fNameDecoded)
    {
        free(fNameDecoded);
    }

    if (NULL != ctx.Shellcode)
    {
        free(ctx.Shellcode);
    }

    if (NULL != ctx.Stack)
    {
        free(ctx.Stack);
    }

    if (NULL != ctx.Intbuf)
    {
        free(ctx.Intbuf);
    }
}